

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O3

token_type __thiscall
nlohmann::json_abi_v3_12_0::detail::
lexer<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_12_0::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::scan_number(lexer<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_12_0::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *this)

{
  char cVar1;
  char_int_type cVar2;
  int *piVar3;
  ulonglong uVar4;
  char *pcVar5;
  token_type tVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  char *endptr;
  char *local_28;
  
  reset(this);
  iVar8 = this->current;
  cVar1 = (char)this;
  if (iVar8 - 0x31U < 9) {
    iVar8 = 5;
LAB_0011c3cf:
    std::__cxx11::string::push_back(cVar1 + 'P');
    while (cVar2 = get(this), cVar2 - 0x30U < 10) {
      std::__cxx11::string::push_back(cVar1 + 'P');
    }
    if (cVar2 != 0x2e) {
      if ((cVar2 != 0x45) && (cVar2 != 0x65)) {
LAB_0011c417:
        unget(this);
        local_28 = (pointer)0x0;
        piVar3 = __errno_location();
        *piVar3 = 0;
        pcVar5 = (this->token_buffer)._M_dataplus._M_p;
        if (iVar8 == 5) {
          uVar4 = strtoull(pcVar5,&local_28,10);
          if (local_28 !=
              (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
            __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O3/external-projects/src/externalJson/include/nlohmann/detail/input/lexer.hpp"
                          ,0x4eb,
                          "token_type nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::scan_number() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
                         );
          }
          if (*piVar3 != 0x22) {
            tVar6 = value_unsigned;
            lVar7 = 0x80;
LAB_0011c49f:
            *(ulonglong *)((long)&(this->ia).current._M_current + lVar7) = uVar4;
            return tVar6;
          }
        }
        else {
          uVar4 = strtoll(pcVar5,&local_28,10);
          if (local_28 !=
              (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
            __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O3/external-projects/src/externalJson/include/nlohmann/detail/input/lexer.hpp"
                          ,0x4fb,
                          "token_type nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::scan_number() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
                         );
          }
          if (*piVar3 != 0x22) {
            tVar6 = value_integer;
            lVar7 = 0x78;
            goto LAB_0011c49f;
          }
        }
        goto LAB_0011c622;
      }
      goto LAB_0011c584;
    }
LAB_0011c51a:
    std::__cxx11::string::push_back(cVar1 + 'P');
    this->decimal_point_position = (this->token_buffer)._M_string_length - 1;
    cVar2 = get(this);
    if (9 < cVar2 - 0x30U) {
      pcVar5 = "invalid number; expected digit after \'.\'";
      goto LAB_0011c5b9;
    }
    do {
      std::__cxx11::string::push_back(cVar1 + 'P');
      cVar2 = get(this);
    } while (cVar2 - 0x30U < 10);
    if ((cVar2 == 0x65) || (cVar2 == 0x45)) goto LAB_0011c584;
  }
  else {
    if (iVar8 == 0x30) {
      std::__cxx11::string::push_back(cVar1 + 'P');
      iVar8 = 5;
    }
    else {
      if (iVar8 != 0x2d) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O3/external-projects/src/externalJson/include/nlohmann/detail/input/lexer.hpp"
                      ,0x3f2,
                      "token_type nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::scan_number() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
                     );
      }
      std::__cxx11::string::push_back(cVar1 + 'P');
      cVar2 = get(this);
      if (cVar2 - 0x31U < 9) {
        iVar8 = 6;
        goto LAB_0011c3cf;
      }
      if (cVar2 != 0x30) {
        pcVar5 = "invalid number; expected digit after \'-\'";
        goto LAB_0011c5b9;
      }
      std::__cxx11::string::push_back(cVar1 + 'P');
      iVar8 = 6;
    }
    cVar2 = get(this);
    if ((cVar2 != 0x65) && (cVar2 != 0x45)) {
      if (cVar2 != 0x2e) goto LAB_0011c417;
      goto LAB_0011c51a;
    }
LAB_0011c584:
    std::__cxx11::string::push_back(cVar1 + 'P');
    cVar2 = get(this);
    if (9 < cVar2 - 0x30U) {
      if ((cVar2 != 0x2d) && (cVar2 != 0x2b)) {
        pcVar5 = "invalid number; expected \'+\', \'-\', or digit after exponent";
LAB_0011c5b9:
        this->error_message = pcVar5;
        return parse_error;
      }
      std::__cxx11::string::push_back(cVar1 + 'P');
      cVar2 = get(this);
      if (9 < cVar2 - 0x30U) {
        pcVar5 = "invalid number; expected digit after exponent sign";
        goto LAB_0011c5b9;
      }
    }
    std::__cxx11::string::push_back(cVar1 + 'P');
    cVar2 = get(this);
    if (cVar2 - 0x30U < 10) {
      do {
        std::__cxx11::string::push_back(cVar1 + 'P');
        cVar2 = get(this);
      } while (cVar2 - 0x30U < 10);
    }
  }
  unget(this);
  local_28 = (pointer)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0;
LAB_0011c622:
  dVar9 = strtod((this->token_buffer)._M_dataplus._M_p,&local_28);
  this->value_float = dVar9;
  if (local_28 == (this->token_buffer)._M_dataplus._M_p + (this->token_buffer)._M_string_length) {
    return value_float;
  }
  __assert_fail("endptr == token_buffer.data() + token_buffer.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O3/external-projects/src/externalJson/include/nlohmann/detail/input/lexer.hpp"
                ,0x50c,
                "token_type nlohmann::detail::lexer<nlohmann::basic_json<>, nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::scan_number() [BasicJsonType = nlohmann::basic_json<>, InputAdapterType = nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
               );
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto] `goto` is used in this function to implement the number-parsing state machine described above. By design, any finite input will eventually reach the "done" state or return token_type::parse_error. In each intermediate state, 1 byte of the input is appended to the token_buffer vector, and only the already initialized variables token_buffer, number_type, and error_message are manipulated.
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // all other characters are rejected outside scan_number()
            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                decimal_point_position = token_buffer.size() - 1;
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                decimal_point_position = token_buffer.size() - 1;
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr; // NOLINT(misc-const-correctness,cppcoreguidelines-pro-type-vararg,hicpp-vararg)
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

            if (errno != ERANGE)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

            if (errno != ERANGE)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }